

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::changeRowsBounds
          (Highs *this,HighsInt num_set_entries,HighsInt *set,double *lower,double *upper)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  string method;
  bool bVar2;
  bool bVar3;
  HighsInt HVar4;
  HighsStatus HVar5;
  undefined8 uVar6;
  HighsLogOptions *log_options;
  vector<int,_std::allocator<int>_> local_set;
  vector<double,_std::allocator<double>_> local_upper;
  vector<double,_std::allocator<double>_> local_lower;
  string local_1c8;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  string local_188;
  string local_168;
  HighsIndexCollection index_collection;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  if (num_set_entries == 0) {
    HVar5 = kOk;
  }
  else {
    log_options = &(this->options_).super_HighsOptionsStruct.log_options;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"row lower bounds","");
    bVar2 = doubleUserDataNotNull(log_options,lower,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"row upper bounds","");
    bVar3 = doubleUserDataNotNull(log_options,upper,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    HVar5 = kError;
    if (!bVar2 && !bVar3) {
      clearDerivedModelProperties(this);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)&local_lower,lower,lower + num_set_entries
                 ,(allocator_type *)&index_collection);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)&local_upper,upper,upper + num_set_entries
                 ,(allocator_type *)&index_collection);
      std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)&local_set,set,set + num_set_entries,
                 (allocator_type *)&index_collection);
      sortSetData(num_set_entries,&local_set,lower,upper,(double *)0x0,
                  local_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  local_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0x0);
      index_collection.dimension_ = -1;
      index_collection.is_interval_ = false;
      index_collection.from_ = -1;
      index_collection.to_ = -2;
      index_collection.is_set_ = false;
      index_collection.set_num_entries_ = -1;
      index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      index_collection._41_8_ = 0;
      HVar4 = create(&index_collection,num_set_entries,
                     local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(this->model_).lp_.num_row_);
      if (HVar4 == 0) {
        HVar5 = changeRowBoundsInterface
                          (this,&index_collection,
                           local_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start);
        local_f8.log_stream = log_options->log_stream;
        local_f8.output_flag = log_options->output_flag;
        local_f8.log_to_console = log_options->log_to_console;
        local_f8.log_dev_level = log_options->log_dev_level;
        local_f8.user_log_callback = log_options->user_log_callback;
        local_f8.user_log_callback_data = log_options->user_log_callback_data;
        pfVar1 = &local_f8.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
        local_f8.user_callback_active =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
        local_f8.user_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"changeRowBounds","");
        HVar5 = interpretCallStatus(&local_f8,HVar5,kOk,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_f8.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
        if (HVar5 == kError) {
          HVar5 = kError;
        }
        else {
          HVar5 = returnFromHighs(this,HVar5);
        }
      }
      else {
        local_98.log_stream = log_options->log_stream;
        local_98.output_flag = log_options->output_flag;
        local_98.log_to_console = log_options->log_to_console;
        local_98.log_dev_level = log_options->log_dev_level;
        local_98.user_log_callback = log_options->user_log_callback;
        local_98.user_log_callback_data = log_options->user_log_callback_data;
        pfVar1 = &local_98.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
        local_98.user_callback_active =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
        local_98.user_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
        uVar6 = 0x20ff8d;
        local_1a8[0] = local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"changeRowsBounds","");
        method._M_string_length = uVar6;
        method._M_dataplus._M_p = (pointer)(ulong)(uint)(this->model_).lp_.num_row_;
        method.field_2._M_allocated_capacity = (size_type)log_options;
        method.field_2._8_8_ = set;
        analyseSetCreateError
                  (&local_98,method,(HighsInt)local_1a8[0],SUB41(HVar4,0),1,
                   (HighsInt *)(ulong)(uint)num_set_entries,
                   (HighsInt)
                   local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0]);
        }
        HVar5 = kError;
        if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_98.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
      }
      if (index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return HVar5;
}

Assistant:

HighsStatus Highs::changeRowsBounds(const HighsInt num_set_entries,
                                    const HighsInt* set, const double* lower,
                                    const double* upper) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  // Check for NULL data in "set" version of changeRowsBounds since
  // values are sorted with set
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(options_.log_options, lower, "row lower bounds") ||
      null_data;
  null_data =
      doubleUserDataNotNull(options_.log_options, upper, "row upper bounds") ||
      null_data;
  if (null_data) return HighsStatus::kError;
  clearDerivedModelProperties();
  // Ensure that the set and data are in ascending order
  std::vector<double> local_lower{lower, lower + num_set_entries};
  std::vector<double> local_upper{upper, upper + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, lower, upper, NULL,
              local_lower.data(), local_upper.data(), NULL);
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeRowsBounds",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_row_);
  HighsStatus call_status = changeRowBoundsInterface(
      index_collection, local_lower.data(), local_upper.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeRowBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}